

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alchitry_Loader.cpp
# Opt level: O3

string * getErrorName_abi_cxx11_(string *__return_storage_ptr__,uint error)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(error) {
  case 0:
    pcVar2 = "FT_OK";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "FT_INVALID_HANDLE";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "FT_DEVICE_NOT_FOUND";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "FT_DEVICE_NOT_OPENED";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "FT_IO_ERROR";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "FT_INSUFFICIENT_RESOURCES";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "FT_INVALID_PARAMETER";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "FT_INVALID_BAUD_RATE";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "FT_DEVICE_NOT_OPENED_FOR_ERASE";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "FT_DEVICE_NOT_OPENED_FOR_WRITE";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "FT_FAILED_TO_WRITE_DEVICE";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "FT_EEPROM_READ_FAILED";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "FT_EEPROM_WRITE_FAILED";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = "FT_EEPROM_ERASE_FAILED";
    pcVar1 = "";
    break;
  case 0xe:
    pcVar2 = "FT_EEPROM_NOT_PRESENT";
    pcVar1 = "";
    break;
  case 0xf:
    pcVar2 = "FT_EEPROM_NOT_PROGRAMMED";
    pcVar1 = "";
    break;
  case 0x10:
    pcVar2 = "FT_INVALID_ARGS";
    pcVar1 = "";
    break;
  case 0x11:
    pcVar2 = "FT_NOT_SUPPORTED";
    pcVar1 = "";
    break;
  case 0x12:
    pcVar2 = "FT_OTHER_ERROR";
    pcVar1 = "";
    break;
  case 0x13:
    pcVar2 = "FT_DEVICE_LIST_NOT_READY";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Unknown";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

string getErrorName(unsigned int error) {
    switch (error) {
        case FT_OK:
            return "FT_OK";
        case FT_INVALID_HANDLE:
            return "FT_INVALID_HANDLE";
        case FT_DEVICE_NOT_FOUND:
            return "FT_DEVICE_NOT_FOUND";
        case FT_DEVICE_NOT_OPENED:
            return "FT_DEVICE_NOT_OPENED";
        case FT_IO_ERROR:
            return "FT_IO_ERROR";
        case FT_INSUFFICIENT_RESOURCES:
            return "FT_INSUFFICIENT_RESOURCES";
        case FT_INVALID_PARAMETER:
            return "FT_INVALID_PARAMETER";
        case FT_INVALID_BAUD_RATE:
            return "FT_INVALID_BAUD_RATE";

        case FT_DEVICE_NOT_OPENED_FOR_ERASE:
            return "FT_DEVICE_NOT_OPENED_FOR_ERASE";
        case FT_DEVICE_NOT_OPENED_FOR_WRITE:
            return "FT_DEVICE_NOT_OPENED_FOR_WRITE";
        case FT_FAILED_TO_WRITE_DEVICE:
            return "FT_FAILED_TO_WRITE_DEVICE";
        case FT_EEPROM_READ_FAILED:
            return "FT_EEPROM_READ_FAILED";
        case FT_EEPROM_WRITE_FAILED:
            return "FT_EEPROM_WRITE_FAILED";
        case FT_EEPROM_ERASE_FAILED:
            return "FT_EEPROM_ERASE_FAILED";
        case FT_EEPROM_NOT_PRESENT:
            return "FT_EEPROM_NOT_PRESENT";
        case FT_EEPROM_NOT_PROGRAMMED:
            return "FT_EEPROM_NOT_PROGRAMMED";
        case FT_INVALID_ARGS:
            return "FT_INVALID_ARGS";
        case FT_NOT_SUPPORTED:
            return "FT_NOT_SUPPORTED";
        case FT_OTHER_ERROR:
            return "FT_OTHER_ERROR";
        case FT_DEVICE_LIST_NOT_READY:
            return "FT_DEVICE_LIST_NOT_READY";
        default:
            return "Unknown";
    }
}